

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
emplace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
          (QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  long lVar1;
  bool bVar2;
  QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *in_RDX;
  SynthesizedMouseData *in_RSI;
  QWindow **in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> copy;
  SynthesizedMouseData *in_stack_ffffffffffffff78;
  SynthesizedMouseData *in_stack_ffffffffffffff80;
  SynthesizedMouseData *in_stack_ffffffffffffff88;
  undefined1 local_50 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::isDetached
                    ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
                     in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
            shouldGrow((Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                        *)*in_RDI);
    if (bVar2) {
      QGuiApplicationPrivate::SynthesizedMouseData::SynthesizedMouseData
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_50 = (undefined1  [16])
                 QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
                 emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>(in_RDX,in_RDI,in_RSI);
      QGuiApplicationPrivate::SynthesizedMouseData::~SynthesizedMouseData
                ((SynthesizedMouseData *)0x3877e4);
    }
    else {
      local_50 = (undefined1  [16])
                 emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                           (in_RDX,in_RDI,in_stack_ffffffffffffff88);
    }
  }
  else {
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::QHash
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
               in_stack_ffffffffffffff80,
               (QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
               in_stack_ffffffffffffff78);
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::detach
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
               in_stack_ffffffffffffff80);
    local_50 = (undefined1  [16])
               emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                         (in_RDX,in_RDI,in_stack_ffffffffffffff88);
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
               in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                 *)local_50._0_8_;
    iVar3.i.bucket = local_50._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }